

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<double>
          (Attribute *this,double t,double *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type_conflict4 *pvVar2;
  optional<double> local_58;
  undefined1 local_48 [8];
  optional<double> v;
  TimeSampleInterpolationType tinterp_local;
  double *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (double *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&v.contained,t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&v.contained);
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<double>(&local_58,&this->_var);
      nonstd::optional_lite::optional<double>::optional<double,_0>
                ((optional<double> *)local_48,&local_58);
      nonstd::optional_lite::optional<double>::~optional(&local_58);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_48);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_48);
        *dst = *pvVar2;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_48);
      if (bVar1) goto LAB_007b63c7;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ = primvar::PrimVar::get_interpolated_value<double>(&this->_var,t,tinterp,dst)
      ;
    }
    else {
      this_local._7_1_ = get_value<double>(this,dst);
    }
  }
LAB_007b63c7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }